

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

D_ParseNode * d_find_in_tree(D_ParseNode *apn,int symbol)

{
  uint uVar1;
  D_Scope *pDVar2;
  D_ParseNode *pDVar3;
  ulong uVar4;
  
  pDVar3 = apn + -2;
  if (apn == (D_ParseNode *)0x0) {
    pDVar3 = (D_ParseNode *)0x0;
  }
  if (pDVar3[2].symbol != symbol) {
    uVar1 = *(uint *)&pDVar3->end_skip;
    if ((ulong)uVar1 == 0) {
      apn = (D_ParseNode *)0x0;
    }
    else {
      pDVar2 = pDVar3->scope;
      apn = (D_ParseNode *)0x0;
      uVar4 = 0;
      do {
        pDVar3 = d_find_in_tree((D_ParseNode *)(*(long *)(&pDVar2->field_0x0 + uVar4 * 8) + 0x90),
                                symbol);
        if (pDVar3 != (D_ParseNode *)0x0) {
          return pDVar3;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return apn;
}

Assistant:

D_ParseNode *d_find_in_tree(D_ParseNode *apn, int symbol) {
  PNode *pn = D_ParseNode_to_PNode(apn);
  D_ParseNode *res;
  uint i;

  if (pn->parse_node.symbol == symbol) return apn;
  for (i = 0; i < pn->children.n; i++)
    if ((res = d_find_in_tree(&pn->children.v[i]->parse_node, symbol))) return res;
  return NULL;
}